

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O2

void mp_rshift_fixed_into(mp_int *r,mp_int *a,size_t bits)

{
  ulong uVar1;
  ulong uVar2;
  BignumInt *pBVar3;
  byte bVar4;
  ulong uVar5;
  size_t i;
  ulong uVar6;
  BignumInt BVar7;
  ulong uVar8;
  
  uVar5 = bits >> 6;
  bVar4 = (byte)bits & 0x3f;
  uVar1 = r->nw;
  for (uVar6 = 0; uVar6 < uVar1; uVar6 = uVar6 + 1) {
    uVar2 = a->nw;
    if (uVar5 < uVar2) {
      BVar7 = a->w[uVar5];
    }
    else {
      BVar7 = 0;
    }
    pBVar3 = r->w;
    pBVar3[uVar6] = BVar7;
    if ((bits & 0x3f) != 0) {
      uVar8 = BVar7 >> bVar4;
      pBVar3[uVar6] = uVar8;
      if (uVar5 + 1 < uVar2) {
        BVar7 = a->w[uVar5 + 1];
      }
      else {
        BVar7 = 0;
      }
      pBVar3[uVar6] = BVar7 << (0x40 - bVar4 & 0x3f) | uVar8;
    }
    uVar5 = uVar5 + 1;
  }
  return;
}

Assistant:

void mp_rshift_fixed_into(mp_int *r, mp_int *a, size_t bits)
{
    size_t words = bits / BIGNUM_INT_BITS;
    size_t bitoff = bits % BIGNUM_INT_BITS;

    for (size_t i = 0; i < r->nw; i++) {
        r->w[i] = mp_word(a, i + words);
        if (bitoff != 0) {
            r->w[i] >>= bitoff;
            r->w[i] |= mp_word(a, i + words + 1) << (BIGNUM_INT_BITS - bitoff);
        }
    }
}